

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# yolov1detection.cpp
# Opt level: O2

void __thiscall ncnn::Yolov1Detection::Yolov1Detection(Yolov1Detection *this)

{
  Layer *pLVar1;
  ParamDict pd;
  
  Layer::Layer(&this->super_Layer);
  (this->super_Layer)._vptr_Layer = (_func_int **)&PTR__Yolov1Detection_00183c88;
  (this->super_Layer).one_blob_only = true;
  (this->super_Layer).support_inplace = true;
  pLVar1 = create_layer(0x20);
  this->softmax = pLVar1;
  ParamDict::ParamDict(&pd);
  ParamDict::set(&pd,0,1);
  ParamDict::set(&pd,1,1);
  (*this->softmax->_vptr_Layer[2])(this->softmax,&pd);
  ParamDict::~ParamDict(&pd);
  return;
}

Assistant:

Yolov1Detection::Yolov1Detection()
{
    one_blob_only = true;
    support_inplace = true;

    softmax = ncnn::create_layer(ncnn::LayerType::Softmax);
    ncnn::ParamDict pd;
    pd.set(0, 1);
    pd.set(1, 1);
    softmax->load_param(pd);
}